

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O1

void __thiscall Catch::TestCaseTracking::SectionTracker::tryOpen(SectionTracker *this)

{
  ITracker *pIVar1;
  int iVar2;
  
  iVar2 = (*(this->super_TrackerBase).super_ITracker._vptr_ITracker[2])();
  if ((char)iVar2 == '\0') {
    (this->super_TrackerBase).m_runState = Executing;
    ((this->super_TrackerBase).m_ctx)->m_currentTracker = (ITracker *)this;
    pIVar1 = (this->super_TrackerBase).m_parent;
    if (pIVar1 != (ITracker *)0x0) {
      (*pIVar1->_vptr_ITracker[0xd])();
      return;
    }
  }
  return;
}

Assistant:

void SectionTracker::tryOpen() {
        if( !isComplete() )
            open();
    }